

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Append
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZFMatrix<double> *u1,TPZFMatrix<double> *u2,
          TPZFMatrix<double> *u12)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long row;
  long lVar4;
  long lVar5;
  long col;
  long lVar6;
  long lVar7;
  
  lVar6 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar7 = (u1->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  lVar3 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar4 = (u2->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar4 == 1 && lVar7 == 1) {
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar6 + lVar3,1);
    lVar4 = 0;
    lVar7 = 0;
    if (0 < lVar6) {
      lVar7 = lVar6;
    }
    for (; lVar7 != lVar4; lVar4 = lVar4 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(u1,lVar4,0);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(u12,lVar4,0);
      *pdVar2 = dVar1;
    }
    lVar7 = 0;
    if (lVar3 < 1) {
      lVar3 = lVar7;
    }
    for (; lVar3 != lVar7; lVar7 = lVar7 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(u2,lVar7,0);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(u12,lVar6 + lVar7,0);
      *pdVar2 = dVar1;
    }
  }
  else {
    lVar5 = lVar3;
    if (lVar3 < lVar6) {
      lVar5 = lVar6;
    }
    (*(u12->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (u12,lVar5,lVar4 + lVar7);
    row = 0;
    lVar5 = 0;
    if (0 < lVar7) {
      lVar5 = lVar7;
    }
    if (lVar6 < 1) {
      lVar6 = row;
    }
    for (; row != lVar6; row = row + 1) {
      for (col = 0; lVar5 != col; col = col + 1) {
        pdVar2 = TPZFMatrix<double>::operator()(u1,row,col);
        dVar1 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(u12,row,col);
        *pdVar2 = dVar1;
      }
    }
    lVar6 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar6;
    }
    if (lVar3 < 1) {
      lVar3 = lVar6;
    }
    for (; lVar6 != lVar3; lVar6 = lVar6 + 1) {
      for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()(u2,lVar6,lVar5);
        dVar1 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()(u12,lVar6,lVar7 + lVar5);
        *pdVar2 = dVar1;
      }
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Append(TPZFMatrix<REAL> &u1, TPZFMatrix<REAL> &u2, TPZFMatrix<REAL> &u12)
{

	bool Is_u1PHI = (u1.Cols() == 1) ? true : false;
	bool Is_u2PHI = (u2.Cols() == 1) ? true : false;

	if(Is_u1PHI && Is_u2PHI)
	{
		int64_t nu1 = u1.Rows(),nu2 = u2.Rows();
		u12.Redim(nu1+nu2,1);
		int64_t i;
		for(i=0; i<nu1; i++) u12(i,0) = u1(i,0);
		for(i=0; i<nu2; i++) u12(i+nu1,0) = u2(i,0);


	}
	else if(!Is_u1PHI || !Is_u2PHI)
	{
		int64_t ru1 = u1.Rows(), cu1 = u1.Cols(), ru2 = u2.Rows(), cu2 = u2.Cols();
		int64_t ru12 = ru1 < ru2 ? ru2 : ru1;
		int64_t cu12 = cu1+cu2;
		u12.Redim(ru12,cu12);
		int64_t i,j;
		for(i=0; i<ru1; i++) for(j=0; j<cu1; j++) u12(i,j) = u1(i,j);
		for(i=0; i<ru2; i++) for(j=0; j<cu2; j++) u12(i,j+cu1) = u2(i,j);
	}
	else
	{
		PZError << "TPZCompElHDiv::Append. Bad input parameters " << std::endl;

	}

}